

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

boundaries __thiscall
fmt::v6::detail::fp::assign_float_with_boundaries<long_double>(fp *this,longdouble d)

{
  undefined1 auVar1 [16];
  ulong in_RDX;
  fp fVar2;
  boundaries bVar3;
  
  this->f = 0;
  this->e = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDX;
  fVar2 = normalize<0>((detail *)0x10000000,(fp)(auVar1 << 0x40));
  bVar3.upper = fVar2.f;
  bVar3.lower = this->f - (0x10000000UL >> (-0xb2 < this->e && this->f == 0x10000000000000)) <<
                ((char)this->e - (char)fVar2.e & 0x3fU);
  return bVar3;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }